

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tostring.cc
# Opt level: O0

int __thiscall
re2::ToStringWalker::PostVisit
          (ToStringWalker *this,Regexp *re,int parent_arg,int pre_arg,int *child_args,
          int nchild_args)

{
  string *psVar1;
  string *psVar2;
  bool bVar3;
  RegexpOp RVar4;
  Rune RVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ParseFlags PVar9;
  int iVar10;
  Rune *pRVar11;
  char *pcVar12;
  long lVar13;
  ostream *poVar14;
  CharClass *this_00;
  iterator pRVar15;
  iterator local_238;
  iterator i_1;
  CharClass *cc;
  string local_208 [32];
  string local_1e8 [48];
  LogMessage local_1b8;
  int local_34;
  int local_30;
  int i;
  int prec;
  int nchild_args_local;
  int *child_args_local;
  int pre_arg_local;
  int parent_arg_local;
  Regexp *re_local;
  ToStringWalker *this_local;
  
  local_30 = parent_arg;
  i = nchild_args;
  _prec = child_args;
  child_args_local._0_4_ = pre_arg;
  child_args_local._4_4_ = parent_arg;
  _pre_arg_local = re;
  re_local = (Regexp *)this;
  RVar4 = Regexp::op(re);
  if (RVar4 - kRegexpNoMatch < 0x14 || RVar4 == kMaxRegexpOp) {
    switch((long)&switchD_0013b4c4::switchdataD_0013e8cc +
           (long)(int)(&switchD_0013b4c4::switchdataD_0013e8cc)[RVar4 - kRegexpNoMatch]) {
    case 0x13b4c6:
      std::__cxx11::string::append((char *)this->t_);
      break;
    case 0x13b4e2:
      if (local_30 < 4) {
        std::__cxx11::string::append((char *)this->t_);
      }
      break;
    case 0x13b504:
      psVar2 = this->t_;
      RVar5 = Regexp::rune(_pre_arg_local);
      PVar9 = Regexp::parse_flags(_pre_arg_local);
      PVar9 = operator&(PVar9,FoldCase);
      AppendLiteral(psVar2,RVar5,PVar9 != NoParseFlags);
      break;
    case 0x13b55d:
      for (local_34 = 0; iVar10 = local_34, iVar7 = Regexp::nrunes(_pre_arg_local), iVar10 < iVar7;
          local_34 = local_34 + 1) {
        psVar2 = this->t_;
        pRVar11 = Regexp::runes(_pre_arg_local);
        RVar5 = pRVar11[local_34];
        PVar9 = Regexp::parse_flags(_pre_arg_local);
        PVar9 = operator&(PVar9,FoldCase);
        AppendLiteral(psVar2,RVar5,PVar9 != NoParseFlags);
      }
      if (local_30 < 2) {
        std::__cxx11::string::append((char *)this->t_);
      }
      break;
    case 0x13b60d:
      if (local_30 < 2) {
        std::__cxx11::string::append((char *)this->t_);
      }
      break;
    case 0x13b62f:
      psVar2 = this->t_;
      std::__cxx11::string::size();
      pcVar12 = (char *)std::__cxx11::string::operator[]((ulong)psVar2);
      if (*pcVar12 == '|') {
        psVar2 = this->t_;
        lVar13 = std::__cxx11::string::size();
        std::__cxx11::string::erase((ulong)psVar2,lVar13 - 1);
      }
      else {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_1b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/tostring.cc"
                   ,0xb6);
        poVar14 = LogMessage::stream(&local_1b8);
        poVar14 = std::operator<<(poVar14,"Bad final char: ");
        std::ostream::operator<<(poVar14,this->t_);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b8);
      }
      if (local_30 < 3) {
        std::__cxx11::string::append((char *)this->t_);
      }
      break;
    case 0x13b75b:
      std::__cxx11::string::append((char *)this->t_);
      PVar9 = Regexp::parse_flags(_pre_arg_local);
      PVar9 = operator&(PVar9,NonGreedy);
      if (PVar9 != NoParseFlags) {
        std::__cxx11::string::append((char *)this->t_);
      }
      if (local_30 < 1) {
        std::__cxx11::string::append((char *)this->t_);
      }
      break;
    case 0x13b7c5:
      std::__cxx11::string::append((char *)this->t_);
      PVar9 = Regexp::parse_flags(_pre_arg_local);
      PVar9 = operator&(PVar9,NonGreedy);
      if (PVar9 != NoParseFlags) {
        std::__cxx11::string::append((char *)this->t_);
      }
      if (local_30 < 1) {
        std::__cxx11::string::append((char *)this->t_);
      }
      break;
    case 0x13b82f:
      std::__cxx11::string::append((char *)this->t_);
      PVar9 = Regexp::parse_flags(_pre_arg_local);
      PVar9 = operator&(PVar9,NonGreedy);
      if (PVar9 != NoParseFlags) {
        std::__cxx11::string::append((char *)this->t_);
      }
      if (local_30 < 1) {
        std::__cxx11::string::append((char *)this->t_);
      }
      break;
    case 0x13b899:
      iVar10 = Regexp::max(_pre_arg_local);
      if (iVar10 == -1) {
        psVar1 = (string *)this->t_;
        uVar6 = Regexp::min(_pre_arg_local);
        StringPrintf_abi_cxx11_((char *)local_1e8,"{%d,}",(ulong)uVar6);
        std::__cxx11::string::append(psVar1);
        std::__cxx11::string::~string(local_1e8);
      }
      else {
        iVar10 = Regexp::min(_pre_arg_local);
        iVar7 = Regexp::max(_pre_arg_local);
        if (iVar10 == iVar7) {
          psVar1 = (string *)this->t_;
          uVar6 = Regexp::min(_pre_arg_local);
          StringPrintf_abi_cxx11_((char *)local_208,"{%d}",(ulong)uVar6);
          std::__cxx11::string::append(psVar1);
          std::__cxx11::string::~string(local_208);
        }
        else {
          psVar1 = (string *)this->t_;
          uVar6 = Regexp::min(_pre_arg_local);
          uVar8 = Regexp::max(_pre_arg_local);
          StringPrintf_abi_cxx11_((char *)&cc,"{%d,%d}",(ulong)uVar6,(ulong)uVar8);
          std::__cxx11::string::append(psVar1);
          std::__cxx11::string::~string((string *)&cc);
        }
      }
      PVar9 = Regexp::parse_flags(_pre_arg_local);
      PVar9 = operator&(PVar9,NonGreedy);
      if (PVar9 != NoParseFlags) {
        std::__cxx11::string::append((char *)this->t_);
      }
      if (local_30 < 1) {
        std::__cxx11::string::append((char *)this->t_);
      }
      break;
    case 0x13bac0:
      std::__cxx11::string::append((char *)this->t_);
      break;
    case 0x13badc:
      std::__cxx11::string::append((char *)this->t_);
      break;
    case 0x13baf8:
      std::__cxx11::string::append((char *)this->t_);
      break;
    case 0x13bb14:
      std::__cxx11::string::append((char *)this->t_);
      break;
    case 0x13bb30:
      std::__cxx11::string::append((char *)this->t_);
      break;
    case 0x13bb4c:
      PVar9 = Regexp::parse_flags(_pre_arg_local);
      PVar9 = operator&(PVar9,WasDollar);
      if (PVar9 == NoParseFlags) {
        std::__cxx11::string::append((char *)this->t_);
      }
      else {
        std::__cxx11::string::append((char *)this->t_);
      }
      break;
    case 0x13bb9b:
      std::__cxx11::string::append((char *)this->t_);
      break;
    case 0x13bbb7:
      std::__cxx11::string::append((char *)this->t_);
      break;
    case 0x13bbd3:
      this_00 = Regexp::cc(_pre_arg_local);
      iVar10 = CharClass::size(this_00);
      if (iVar10 == 0) {
        std::__cxx11::string::append((char *)this->t_);
      }
      else {
        std::__cxx11::string::append((char *)this->t_);
        i_1 = (iterator)Regexp::cc(_pre_arg_local);
        bVar3 = CharClass::Contains((CharClass *)i_1,0xfffe);
        if (bVar3) {
          i_1 = (iterator)CharClass::Negate((CharClass *)i_1);
          std::__cxx11::string::append((char *)this->t_);
        }
        for (local_238 = CharClass::begin((CharClass *)i_1);
            pRVar15 = CharClass::end((CharClass *)i_1), local_238 != pRVar15;
            local_238 = local_238 + 1) {
          AppendCCRange(this->t_,local_238->lo,local_238->hi);
        }
        pRVar15 = (iterator)Regexp::cc(_pre_arg_local);
        if (i_1 != pRVar15) {
          CharClass::Delete((CharClass *)i_1);
        }
        std::__cxx11::string::append((char *)this->t_);
      }
      break;
    case 0x13bd2e:
      std::__cxx11::string::append((char *)this->t_);
      break;
    case 0x13bd47:
      psVar2 = this->t_;
      Regexp::match_id(_pre_arg_local);
      std::__cxx11::string::append((char *)psVar2,0x13e9f6);
    }
  }
  if (local_30 == 3) {
    std::__cxx11::string::append((char *)this->t_);
  }
  return 0;
}

Assistant:

int ToStringWalker::PostVisit(Regexp* re, int parent_arg, int pre_arg,
                              int* child_args, int nchild_args) {
  int prec = parent_arg;
  switch (re->op()) {
    case kRegexpNoMatch:
      // There's no simple symbol for "no match", but
      // [^0-Runemax] excludes everything.
      t_->append("[^\\x00-\\x{10ffff}]");
      break;

    case kRegexpEmptyMatch:
      // Append (?:) to make empty string visible,
      // unless this is already being parenthesized.
      if (prec < PrecEmpty)
        t_->append("(?:)");
      break;

    case kRegexpLiteral:
      AppendLiteral(t_, re->rune(),
                    (re->parse_flags() & Regexp::FoldCase) != 0);
      break;

    case kRegexpLiteralString:
      for (int i = 0; i < re->nrunes(); i++)
        AppendLiteral(t_, re->runes()[i],
                      (re->parse_flags() & Regexp::FoldCase) != 0);
      if (prec < PrecConcat)
        t_->append(")");
      break;

    case kRegexpConcat:
      if (prec < PrecConcat)
        t_->append(")");
      break;

    case kRegexpAlternate:
      // Clumsy but workable: the children all appended |
      // at the end of their strings, so just remove the last one.
      if ((*t_)[t_->size()-1] == '|')
        t_->erase(t_->size()-1);
      else
        LOG(DFATAL) << "Bad final char: " << t_;
      if (prec < PrecAlternate)
        t_->append(")");
      break;

    case kRegexpStar:
      t_->append("*");
      if (re->parse_flags() & Regexp::NonGreedy)
        t_->append("?");
      if (prec < PrecUnary)
        t_->append(")");
      break;

    case kRegexpPlus:
      t_->append("+");
      if (re->parse_flags() & Regexp::NonGreedy)
        t_->append("?");
      if (prec < PrecUnary)
        t_->append(")");
      break;

    case kRegexpQuest:
      t_->append("?");
      if (re->parse_flags() & Regexp::NonGreedy)
        t_->append("?");
      if (prec < PrecUnary)
        t_->append(")");
      break;

    case kRegexpRepeat:
      if (re->max() == -1)
        t_->append(StringPrintf("{%d,}", re->min()));
      else if (re->min() == re->max())
        t_->append(StringPrintf("{%d}", re->min()));
      else
        t_->append(StringPrintf("{%d,%d}", re->min(), re->max()));
      if (re->parse_flags() & Regexp::NonGreedy)
        t_->append("?");
      if (prec < PrecUnary)
        t_->append(")");
      break;

    case kRegexpAnyChar:
      t_->append(".");
      break;

    case kRegexpAnyByte:
      t_->append("\\C");
      break;

    case kRegexpBeginLine:
      t_->append("^");
      break;

    case kRegexpEndLine:
      t_->append("$");
      break;

    case kRegexpBeginText:
      t_->append("(?-m:^)");
      break;

    case kRegexpEndText:
      if (re->parse_flags() & Regexp::WasDollar)
        t_->append("(?-m:$)");
      else
        t_->append("\\z");
      break;

    case kRegexpWordBoundary:
      t_->append("\\b");
      break;

    case kRegexpNoWordBoundary:
      t_->append("\\B");
      break;

    case kRegexpCharClass: {
      if (re->cc()->size() == 0) {
        t_->append("[^\\x00-\\x{10ffff}]");
        break;
      }
      t_->append("[");
      // Heuristic: show class as negated if it contains the
      // non-character 0xFFFE.
      CharClass* cc = re->cc();
      if (cc->Contains(0xFFFE)) {
        cc = cc->Negate();
        t_->append("^");
      }
      for (CharClass::iterator i = cc->begin(); i != cc->end(); ++i)
        AppendCCRange(t_, i->lo, i->hi);
      if (cc != re->cc())
        cc->Delete();
      t_->append("]");
      break;
    }

    case kRegexpCapture:
      t_->append(")");
      break;

    case kRegexpHaveMatch:
      // There's no syntax accepted by the parser to generate
      // this node (it is generated by RE2::Set) so make something
      // up that is readable but won't compile.
      t_->append("(?HaveMatch:%d)", re->match_id());
      break;
  }

  // If the parent is an alternation, append the | for it.
  if (prec == PrecAlternate)
    t_->append("|");

  return 0;
}